

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O0

void saa1099v_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  UINT32 steps;
  byte *pbVar2;
  uint local_4c;
  uint local_48;
  int local_44;
  int local_40;
  DEV_SMPL outVolR;
  DEV_SMPL outVolL;
  DEV_SMPL outState;
  UINT8 noDCremove;
  UINT8 neChn;
  UINT8 curChn;
  UINT32 curSmpl;
  SAA_CHN *saaCh;
  SAA_CHIP *saa;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  if (*(char *)((long)param + 0x90) != '\0') {
    for (outState = 0; (uint)outState < samples; outState = outState + 1) {
      for (outVolL._3_1_ = 0; outVolL._3_1_ < 6; outVolL._3_1_ = outVolL._3_1_ + 1) {
        pbVar2 = (byte *)((long)param + (ulong)outVolL._3_1_ * 0xe + 8);
        if (pbVar2[0xd] == 0) {
          bVar1 = outVolL._3_1_ / 3;
          outVolL._1_1_ = '\0';
          if ((pbVar2[4] == 0) || (pbVar2[5] == 0)) {
            if (pbVar2[4] == 0) {
              local_48 = 1;
            }
            else {
              local_48 = (uint)pbVar2[0xc];
            }
            if (pbVar2[5] == 0) {
              local_4c = 1;
            }
            else {
              local_4c = *(uint *)((long)param + (ulong)bVar1 * 0x10 + 0x60) & 1;
            }
            outVolR = (local_4c & local_48) << 1;
          }
          else {
            outVolR = (DEV_SMPL)pbVar2[0xc];
            if (pbVar2[0xc] != 0) {
              outVolR = (*(uint *)((long)param + (ulong)bVar1 * 0x10 + 0x60) & 1) + outVolR;
            }
          }
          if (((outVolL._3_1_ == 2) || (outVolL._3_1_ == 5)) &&
             (*(char *)((long)param + (ulong)bVar1 * 10 + 0x7c) != '\0')) {
            local_40 = (int)(*(int *)((long)param + (long)(int)(*pbVar2 & 0xfffffffe) * 4 + 0xb4) *
                            (uint)*(byte *)((long)param + (ulong)bVar1 * 10 + 0x84)) >> 4;
            local_44 = (int)(*(int *)((long)param + (long)(int)(pbVar2[1] & 0xfffffffe) * 4 + 0xb4)
                            * (uint)*(byte *)((long)param + (ulong)bVar1 * 10 + 0x85)) >> 4;
            if ((pbVar2[4] == 0) && (pbVar2[5] == 0)) {
              outVolL._1_1_ = '\x02';
            }
          }
          else {
            local_40 = *(int *)((long)param + (ulong)*pbVar2 * 4 + 0xb4);
            local_44 = *(int *)((long)param + (ulong)pbVar2[1] * 4 + 0xb4);
            if ((pbVar2[4] == 0) && (pbVar2[5] == 0)) {
              outVolL._1_1_ = '\x01';
            }
          }
          if (outVolL._1_1_ == '\0') {
            (*outputs)[(uint)outState] = (outVolR + -1) * local_40 + (*outputs)[(uint)outState];
            outputs[1][(uint)outState] = (outVolR + -1) * local_44 + outputs[1][(uint)outState];
          }
          else if (outVolL._1_1_ == '\x01') {
            (*outputs)[(uint)outState] = outVolR * local_40 + (*outputs)[(uint)outState];
            outputs[1][(uint)outState] = outVolR * local_44 + outputs[1][(uint)outState];
          }
          else {
            (*outputs)[(uint)outState] =
                 (outVolR * local_40 -
                 *(int *)((long)param + (long)(int)(*pbVar2 & 0xfffffffe) * 4 + 0xb4)) +
                 (*outputs)[(uint)outState];
            outputs[1][(uint)outState] =
                 (outVolR * local_44 -
                 *(int *)((long)param + (long)(int)(pbVar2[1] & 0xfffffffe) * 4 + 0xb4)) +
                 outputs[1][(uint)outState];
          }
        }
      }
      RC_STEP((RATIO_CNTR *)((long)param + 0xf8));
      steps = RC_GET_VAL((RATIO_CNTR *)((long)param + 0xf8));
      saa_advance((SAA_CHIP *)param,steps);
      RC_MASK((RATIO_CNTR *)((long)param + 0xf8));
    }
  }
  return;
}

Assistant:

static void saa1099v_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	SAA_CHIP* saa = (SAA_CHIP*)param;
	SAA_CHN* saaCh;
	UINT32 curSmpl;
	UINT8 curChn;
	UINT8 neChn;	// noise/envelope channel
	UINT8 noDCremove;
	DEV_SMPL outState;
	DEV_SMPL outVolL;
	DEV_SMPL outVolR;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (! saa->allOn)
		return;
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		for (curChn = 0; curChn < 6; curChn ++)
		{
			saaCh = &saa->channels[curChn];
			if (saaCh->muted)
				continue;
			neChn = curChn / 3;
			noDCremove = 0;
			
			if (saaCh->toneOn && saaCh->noiseOn)
			{
				// mixing tone+noise works like this
				outState = saaCh->state;
				if (saaCh->state)
					outState += (saa->noise[neChn].state & 0x01);
			}
			else
			{
				outState  = (saaCh->toneOn) ? saaCh->state : 1;
				outState &= (saaCh->noiseOn) ? (saa->noise[neChn].state & 0x01) : 1;
				outState *= 2;	// make the same amplitude as when mixing tone+noise
			}
			
			if ((curChn == 2 || curChn == 5) && saa->env[neChn].enable)
			{
				// enabling the envelope generator disables amplitude bit 0
				outVolL = (saa->volTbl[saaCh->volL & ~0x01] * saa->env[neChn].volL) >> 4;
				outVolR = (saa->volTbl[saaCh->volR & ~0x01] * saa->env[neChn].volR) >> 4;
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 2;
			}
			else
			{
				outVolL = saa->volTbl[saaCh->volL];
				outVolR = saa->volTbl[saaCh->volR];
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 1;
			}
			
			// tone XOR noise enabled: outState can be: 0 [off], 2 [on]
			// tone + noise enabled: outState can be: 0 [both off], 1 [only tone on], 2 [both on]
			if (! noDCremove)
			{
				outState = outState - 1;	// DC offset removal and make bipolar
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else if (noDCremove == 1)
			{
				// just ignore offset removal (makes software-PCM work)
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else //if (noDCremove == 2)
			{
				// set "center" based on current volume level (for EnvGen-based sounds)
				outputs[0][curSmpl] += outState * outVolL - saa->volTbl[saaCh->volL & ~0x01];
				outputs[1][curSmpl] += outState * outVolR - saa->volTbl[saaCh->volR & ~0x01];
			}
		}
		
		// Updating after calculating the sample output improves emulation of a few artifacts.
		// (like the peak down after the frequency generator reset)
		RC_STEP(&saa->stepCntr);
		saa_advance(saa, RC_GET_VAL(&saa->stepCntr));
		RC_MASK(&saa->stepCntr);
	}
	
	return;
}